

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparsityStructure.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::SparsityStructure::addDenseBlock
          (SparsityStructure *this,IndexRange *rowsRange,IndexRange *columnsRange)

{
  char cVar1;
  char *pcVar2;
  
  cVar1 = iDynTree::IndexRange::isValid();
  if (cVar1 == '\0') {
    pcVar2 = "The rowsRange is not valid.";
  }
  else {
    cVar1 = iDynTree::IndexRange::isValid();
    if (cVar1 != '\0') {
      addDenseBlock(this,rowsRange->offset,columnsRange->offset,rowsRange->size,columnsRange->size);
      return true;
    }
    pcVar2 = "The columnsRange is not valid.";
  }
  iDynTree::reportError("SparsityStructure","addDenseBlock",pcVar2);
  return false;
}

Assistant:

bool iDynTree::optimalcontrol::SparsityStructure::addDenseBlock(const iDynTree::IndexRange &rowsRange, const iDynTree::IndexRange &columnsRange)
{
    if (!rowsRange.isValid()) {
        reportError("SparsityStructure", "addDenseBlock", "The rowsRange is not valid.");
        return false;
    }

    if (!columnsRange.isValid()) {
        reportError("SparsityStructure", "addDenseBlock", "The columnsRange is not valid.");
        return false;
    }

    addDenseBlock(static_cast<size_t>(rowsRange.offset),
                  static_cast<size_t>(columnsRange.offset),
                  static_cast<size_t>(rowsRange.size),
                  static_cast<size_t>(columnsRange.size));

    return true;
}